

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_optional_asn1_uint64(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag,uint64_t default_value)

{
  int iVar1;
  int iVar2;
  int present;
  CBS child;
  int local_2c;
  CBS local_28;
  
  iVar1 = CBS_get_optional_asn1(cbs,&local_28,&local_2c,tag);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (local_2c == 0) {
      *out = default_value;
    }
    else {
      iVar1 = CBS_get_asn1_uint64_with_tag(&local_28,out,2);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_28.len != 0) {
        return 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CBS_get_optional_asn1_uint64(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag,
                                 uint64_t default_value) {
  CBS child;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    if (!CBS_get_asn1_uint64(&child, out) || CBS_len(&child) != 0) {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}